

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::Block::AddSwitchBranchTo
          (Block *this,Block *Target,vector<unsigned_int,_std::allocator<unsigned_int>_> *Values,
          Expression *Code)

{
  bool bVar1;
  Branch *pBVar2;
  Branch **ppBVar3;
  Expression *Code_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Values_local;
  Block *Target_local;
  Block *this_local;
  
  Values_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)Target;
  Target_local = this;
  bVar1 = contains<wasm::InsertOrderedMap<CFG::Block*,CFG::Branch*>,CFG::Block*>
                    (&this->BranchesOut,(Block **)&Values_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!contains(BranchesOut, Target)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                  ,0x9f,
                  "void CFG::Block::AddSwitchBranchTo(Block *, std::vector<wasm::Index> &&, wasm::Expression *)"
                 );
  }
  pBVar2 = Relooper::AddBranch(this->relooper,Values,Code);
  ppBVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                      (&this->BranchesOut,(Block **)&Values_local);
  *ppBVar3 = pBVar2;
  return;
}

Assistant:

void Block::AddSwitchBranchTo(Block* Target,
                              std::vector<wasm::Index>&& Values,
                              wasm::Expression* Code) {
  // cannot add more than one branch to the same target
  assert(!contains(BranchesOut, Target));
  BranchesOut[Target] = relooper->AddBranch(std::move(Values), Code);
}